

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other_functions.h
# Opt level: O2

void helpSuccessorNode(args *t,edge *helpeeEdge,size_t depth)

{
  node *pnVar1;
  __pointer_type pnVar2;
  node *pnVar3;
  undefined7 uVar4;
  stateRecord *state;
  
  pnVar1 = helpeeEdge->parent;
  pnVar2 = helpeeEdge->child->child[0]._M_b._M_p;
  state = (stateRecord *)malloc(0x98);
  (state->targetEdge).parent = (node *)0x0;
  (state->targetEdge).child = (node *)((ulong)pnVar2 & 0xfffffffffffffff0);
  (state->targetEdge).which = false;
  state->depth = depth;
  state->mode = DISCOVERY;
  pnVar3 = helpeeEdge->child;
  (state->successorRecord).lastEdge.parent = helpeeEdge->parent;
  (state->successorRecord).lastEdge.child = pnVar3;
  uVar4 = *(undefined7 *)&helpeeEdge->field_0x11;
  (state->successorRecord).lastEdge.which = helpeeEdge->which;
  *(undefined7 *)&(state->successorRecord).lastEdge.field_0x11 = uVar4;
  (state->successorRecord).pLastEdge.parent = (node *)0x0;
  (state->successorRecord).pLastEdge.child = pnVar1;
  (state->successorRecord).pLastEdge.which = false;
  removeSuccessor(t,state);
  return;
}

Assistant:

void helpSuccessorNode(struct args* t, struct edge* helpeeEdge, size_t depth)
{
    struct node* parent;
    struct node* node;
    struct node* left;
    struct stateRecord* state;
    struct seekRecord* s;
    parent = helpeeEdge->parent;
    node = helpeeEdge->child;
    left=getAddress(node->child[LC]);
    state = (struct stateRecord*) malloc(sizeof(struct stateRecord));
    fillTheEdge(&state->targetEdge,NULL,left,LC);
    state->depth = depth;
    state->mode = DISCOVERY;
    s = &state->successorRecord;
    s->lastEdge = *helpeeEdge;
    fillTheEdge(&s->pLastEdge,NULL,parent,LC);
    removeSuccessor(t,state);
    return;
}